

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.h
# Opt level: O3

void __thiscall
CoreML::Specification::DenseVector::_internal_add_values(DenseVector *this,double value)

{
  RepeatedField<double> *this_00;
  uint uVar1;
  double *pdVar2;
  
  this_00 = &this->values_;
  uVar1 = (this->values_).current_size_;
  if (uVar1 == (this->values_).total_size_) {
    google::protobuf::RepeatedField<double>::Reserve(this_00,uVar1 + 1);
    pdVar2 = google::protobuf::RepeatedField<double>::elements(this_00);
    pdVar2[uVar1] = value;
  }
  else {
    pdVar2 = google::protobuf::RepeatedField<double>::elements(this_00);
    pdVar2[uVar1] = value;
  }
  this_00->current_size_ = uVar1 + 1;
  return;
}

Assistant:

inline void DenseVector::_internal_add_values(double value) {
  values_.Add(value);
}